

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

Var __thiscall
Js::TypedArrayBase::FindMinOrMax<float,true>
          (TypedArrayBase *this,ScriptContext *scriptContext,bool findMax)

{
  uint uVar1;
  float *pfVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 *puVar9;
  ulong uVar10;
  Var pvVar11;
  uint i;
  long lVar12;
  float fVar13;
  float fVar14;
  Var local_60;
  
  pfVar2 = (float *)this->buffer;
  uVar8 = (ulong)(this->super_ArrayBufferParent).super_ArrayObject.length;
  uVar1 = this->byteOffset;
  uVar7 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar7 < (ulong)uVar1 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9e8,
                                "(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())",
                                "sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()");
    if (!bVar5) {
LAB_00d7fe13:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  fVar13 = *pfVar2;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  lVar12 = 4;
  uVar4 = 0;
  do {
    uVar10 = uVar4;
    fVar14 = fVar13;
    if (uVar8 == uVar10) break;
    uVar1 = this->byteOffset;
    uVar7 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar7 < (ulong)uVar1 + lVar12) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0x9ec,
                                  "((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar5) goto LAB_00d7fe13;
      *puVar9 = 0;
    }
    fVar14 = pfVar2[uVar10];
    bVar5 = NumberUtilities::IsNan((double)fVar14);
    if (bVar5) {
      local_60 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).nan.ptr;
      fVar14 = fVar13;
    }
    else if (findMax) {
      if (fVar14 <= fVar13) {
LAB_00d7fdc1:
        fVar14 = fVar13;
      }
    }
    else if ((fVar13 <= fVar14) &&
            (((fVar14 != 0.0 || (NAN(fVar14))) ||
             (bVar6 = NumberUtilities::IsSpecial((double)fVar13,0x8000000000000000), !bVar6))))
    goto LAB_00d7fdc1;
    lVar12 = lVar12 + 4;
    uVar4 = uVar10 + 1;
    fVar13 = fVar14;
  } while (!bVar5);
  if (uVar8 <= uVar10) {
    pvVar11 = JavascriptNumber::ToVarNoCheck((double)fVar14,scriptContext);
    return pvVar11;
  }
  return local_60;
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        T* typedBuffer = (T*)this->buffer;
        uint len = this->GetLength();

        Assert(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        T currentRes = typedBuffer[0];
        for (uint i = 0; i < len; i++)
        {
            Assert((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            T compare = typedBuffer[i];
            if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
            if (findMax ? currentRes < compare : currentRes > compare ||
                (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
            {
                currentRes = compare;
            }
        }
        return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
    }